

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_compare_siblings_
                 (lyd_node *node1,lyd_node *node2,uint32_t options,ly_bool parental_schemas_checked)

{
  LY_ERR LVar1;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_node *iter2;
  ly_bool local_25;
  LY_ERR r;
  ly_bool parental_schemas_checked_local;
  lyd_node *plStack_20;
  uint32_t options_local;
  lyd_node *node2_local;
  lyd_node *node1_local;
  
  local_25 = parental_schemas_checked;
  r = options;
  plStack_20 = node2;
  node2_local = node1;
  while( true ) {
    if (node2_local == (lyd_node *)0x0 || plStack_20 == (lyd_node *)0x0) {
      node1_local._4_4_ = LY_SUCCESS;
      if (node2_local != (lyd_node *)0x0 || plStack_20 != (lyd_node *)0x0) {
        node1_local._4_4_ = LY_ENOT;
      }
      return node1_local._4_4_;
    }
    iter2._4_4_ = lyd_compare_single_schema(node2_local,plStack_20,r,local_25);
    if (iter2._4_4_ != LY_SUCCESS) break;
    if (((node2_local->schema == (lysc_node *)0x0) ||
        (((node2_local->schema->nodetype != 0x10 || ((node2_local->schema->flags & 0x200) != 0)) &&
         ((node2_local->schema->nodetype != 8 || ((node2_local->schema->flags & 1) == 0)))))) ||
       ((node2_local->schema->flags & 0x80) == 0)) {
      _ret___1 = plStack_20;
      iter2._4_4_ = LY_SUCCESS;
    }
    else {
      iter2._4_4_ = lyd_find_sibling_first(plStack_20,node2_local,(lyd_node **)&ret___1);
      if (iter2._4_4_ == LY_ENOTFOUND) {
        iter2._4_4_ = LY_ENOT;
      }
      if (iter2._4_4_ != LY_SUCCESS) {
        return iter2._4_4_;
      }
    }
    LVar1 = lyd_compare_single_data(node2_local,_ret___1,r | LY_EMEM);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    node2_local = node2_local->next;
    plStack_20 = plStack_20->next;
    iter2._4_4_ = 0;
  }
  return iter2._4_4_;
}

Assistant:

static LY_ERR
lyd_compare_siblings_(const struct lyd_node *node1, const struct lyd_node *node2, uint32_t options,
        ly_bool parental_schemas_checked)
{
    LY_ERR r;
    const struct lyd_node *iter2;

    while (node1 && node2) {
        /* schema match */
        r = lyd_compare_single_schema(node1, node2, options, parental_schemas_checked);
        LY_CHECK_RET(r);

        if (node1->schema && (((node1->schema->nodetype == LYS_LIST) && !(node1->schema->flags & LYS_KEYLESS)) ||
                ((node1->schema->nodetype == LYS_LEAFLIST) && (node1->schema->flags & LYS_CONFIG_W))) &&
                (node1->schema->flags & LYS_ORDBY_SYSTEM)) {
            /* find a matching instance in case they are ordered differently */
            r = lyd_find_sibling_first(node2, node1, (struct lyd_node **)&iter2);
            if (r == LY_ENOTFOUND) {
                /* no matching instance, data not equal */
                r = LY_ENOT;
            }
            LY_CHECK_RET(r);
        } else {
            /* compare with the current node */
            iter2 = node2;
        }

        /* data match */
        r = lyd_compare_single_data(node1, iter2, options | LYD_COMPARE_FULL_RECURSION);
        LY_CHECK_RET(r);

        node1 = node1->next;
        node2 = node2->next;
    }

    return (node1 || node2) ? LY_ENOT : LY_SUCCESS;
}